

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTDiagMap.cpp
# Opt level: O0

Diagnostics * __thiscall
slang::ast::ASTDiagMap::coalesce(ASTDiagMap *this,SourceManager *sourceManager)

{
  string_view arg;
  string_view arg_00;
  bool bVar1;
  __tuple_element_t<1UL,_tuple<DiagCode,_SourceLocation>_> *this_00;
  InstanceBodySymbol *pIVar2;
  long in_RDX;
  SmallVectorBase<slang::Diagnostic> *in_RDI;
  Diagnostic d_1;
  Diagnostic d;
  iterator it;
  Diagnostic diag_2;
  Symbol *sym;
  Scope *scope_1;
  InstanceSymbol *parent;
  CheckerInstanceBodySymbol *checkerBody;
  Scope *scope;
  Symbol *symbol;
  Diagnostic *diag_1;
  iterator __end3;
  iterator __begin3;
  type *__range3;
  bool differingArgs;
  size_t count;
  Symbol *inst;
  Diagnostic *found;
  Diagnostic *diag;
  iterator __end4;
  iterator __begin4;
  type *__range4;
  type *diagList;
  type *key;
  iterator __end2;
  iterator __begin2;
  flat_hash_map<std::tuple<DiagCode,_SourceLocation>,_std::vector<Diagnostic>_> *__range2;
  Diagnostics *results;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  *in_stack_fffffffffffffca8;
  undefined7 in_stack_fffffffffffffcb0;
  undefined1 in_stack_fffffffffffffcb7;
  SourceLocation in_stack_fffffffffffffcb8;
  Diagnostics *in_stack_fffffffffffffcc0;
  DefinitionSymbol *in_stack_fffffffffffffcc8;
  InstanceSymbol *in_stack_fffffffffffffcd0;
  Diagnostic *in_stack_fffffffffffffcf0;
  Diagnostic *in_stack_fffffffffffffcf8;
  Scope *in_stack_fffffffffffffd00;
  __normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
  local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_158;
  undefined8 uStack_150;
  InstanceSymbol *local_138;
  Symbol *local_130;
  Scope *local_128;
  InstanceSymbol *local_120;
  size_t local_118;
  char *pcStack_110;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  SourceLocation local_f8;
  undefined4 local_f0;
  bitmask<slang::ast::InstanceFlags> local_e9;
  CheckerInstanceBodySymbol *local_e8;
  Scope *local_e0;
  Diagnostic *local_d8;
  reference local_d0;
  Diagnostic *local_c8;
  __normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
  local_c0;
  type *local_b8;
  byte local_a9;
  Diagnostics *local_a8;
  InstanceSymbol *local_a0;
  reference local_98;
  reference local_90;
  Diagnostic *local_88;
  __normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
  local_80;
  type *local_78;
  type *local_70;
  type *local_68;
  reference local_60;
  iterator local_48;
  iterator local_38;
  undefined1 local_19;
  long local_18;
  
  local_19 = 0;
  local_18 = in_RDX;
  Diagnostics::Diagnostics((Diagnostics *)0xaa59df);
  local_38 = boost::unordered::
             unordered_flat_map<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
             ::begin((unordered_flat_map<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
                      *)0xaa59fc);
  local_48 = boost::unordered::
             unordered_flat_map<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
             ::end((unordered_flat_map<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
                    *)0xaa5a19);
  do {
    bVar1 = boost::unordered::detail::foa::operator!=
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                        *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                       in_stack_fffffffffffffca8);
    if (!bVar1) {
      if (local_18 != 0) {
        Diagnostics::sort(in_stack_fffffffffffffcc0,(SourceManager *)in_stack_fffffffffffffcb8);
      }
      return (Diagnostics *)in_RDI;
    }
    local_60 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
               ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                            *)0xaa5a64);
    local_68 = std::
               get<0ul,std::tuple<slang::DiagCode,slang::SourceLocation>const,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>
                         ((pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                           *)0xaa5a79);
    local_70 = std::
               get<1ul,std::tuple<slang::DiagCode,slang::SourceLocation>const,std::vector<slang::Diagnostic,std::allocator<slang::Diagnostic>>>
                         ((pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                           *)0xaa5a8e);
    this_00 = std::get<1ul,slang::DiagCode,slang::SourceLocation>
                        ((tuple<slang::DiagCode,_slang::SourceLocation> *)0xaa5aa3);
    bVar1 = SourceLocation::operator==(this_00,(SourceLocation *)&SourceLocation::NoLocation);
    if (bVar1) {
      local_78 = local_70;
      local_80._M_current =
           (Diagnostic *)
           std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::begin
                     ((vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)
                      in_stack_fffffffffffffca8);
      local_88 = (Diagnostic *)
                 std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::end
                           ((vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)
                            in_stack_fffffffffffffca8);
      while (bVar1 = __gnu_cxx::
                     operator==<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                               ((__normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                                (__normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                                 *)in_stack_fffffffffffffca8), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_90 = __gnu_cxx::
                   __normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                   ::operator*(&local_80);
        SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic&>
                  ((SmallVectorBase<slang::Diagnostic> *)in_stack_fffffffffffffcb8,
                   (Diagnostic *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
        __gnu_cxx::
        __normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
        ::operator++(&local_80);
      }
    }
    else {
      local_98 = (reference)0x0;
      local_a0 = (InstanceSymbol *)0x0;
      local_a8 = (Diagnostics *)0x0;
      local_a9 = 0;
      local_b8 = local_70;
      local_c0._M_current =
           (Diagnostic *)
           std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::begin
                     ((vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)
                      in_stack_fffffffffffffca8);
      local_c8 = (Diagnostic *)
                 std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::end
                           ((vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)
                            in_stack_fffffffffffffca8);
      while (bVar1 = __gnu_cxx::
                     operator==<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                               ((__normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                                 *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                                (__normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                                 *)in_stack_fffffffffffffca8), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_d0 = __gnu_cxx::
                   __normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                   ::operator*(&local_c0);
        if ((local_98 != (reference)0x0) &&
           (bVar1 = Diagnostic::operator==(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0),
           ((bVar1 ^ 0xffU) & 1) != 0)) {
          local_a9 = 1;
          break;
        }
        local_d8 = (Diagnostic *)local_d0->symbol;
        while( true ) {
          bVar1 = false;
          if (local_d8 != (Diagnostic *)0x0) {
            bVar1 = *(int *)&(local_d8->args).
                             super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start != 0x30;
          }
          if (!bVar1) break;
          if (*(int *)&(local_d8->args).
                       super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start == 0x58) {
            local_e8 = Symbol::as<slang::ast::CheckerInstanceBodySymbol>((Symbol *)0xaa5cc8);
            local_e0 = Symbol::getParentScope((Symbol *)local_e8->parentInstance);
            bitmask<slang::ast::InstanceFlags>::bitmask(&local_e9,Uninstantiated);
            bVar1 = bitmask<slang::ast::InstanceFlags>::has
                              ((bitmask<slang::ast::InstanceFlags> *)
                               CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                               (bitmask<slang::ast::InstanceFlags> *)in_stack_fffffffffffffca8);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              local_f0 = 0x540008;
              local_f8 = (local_e8->parentInstance->super_InstanceSymbolBase).super_Symbol.location;
              Diagnostic::addNote((Diagnostic *)
                                  CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                                  SUB84((ulong)in_stack_fffffffffffffcc0 >> 0x20,0),
                                  in_stack_fffffffffffffcb8);
              local_108 = sv((char *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                             (size_t)in_stack_fffffffffffffca8);
              arg._M_str = (char *)in_stack_fffffffffffffd00;
              arg._M_len = (size_t)in_stack_fffffffffffffcf8;
              Diagnostic::operator<<(in_stack_fffffffffffffcf0,arg);
              local_118 = (local_e8->checker->super_Symbol).name._M_len;
              pcStack_110 = (local_e8->checker->super_Symbol).name._M_str;
              arg_00._M_str = (char *)in_stack_fffffffffffffd00;
              arg_00._M_len = (size_t)in_stack_fffffffffffffcf8;
              Diagnostic::operator<<(in_stack_fffffffffffffcf0,arg_00);
            }
          }
          else {
            in_stack_fffffffffffffd00 = Symbol::getParentScope((Symbol *)local_d8);
            local_e0 = in_stack_fffffffffffffd00;
          }
          if (local_e0 == (Scope *)0x0) {
            in_stack_fffffffffffffcf0 = (Diagnostic *)0x0;
            local_d8 = in_stack_fffffffffffffcf0;
          }
          else {
            in_stack_fffffffffffffcf0 = (Diagnostic *)Scope::asSymbol(local_e0);
            in_stack_fffffffffffffcf8 = in_stack_fffffffffffffcf0;
            local_d8 = in_stack_fffffffffffffcf0;
          }
        }
        if (local_d8 != (Diagnostic *)0x0) {
          pIVar2 = Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0xaa5e94);
          local_120 = pIVar2->parentInstance;
          local_a8 = (Diagnostics *)
                     ((long)&(local_a8->super_SmallVector<slang::Diagnostic,_2UL>).
                             super_SmallVectorBase<slang::Diagnostic>.data_ + 1);
          local_128 = Symbol::getParentScope((Symbol *)local_120);
          if (((local_128 != (Scope *)0x0) &&
              (local_130 = Scope::asSymbol(local_128), local_130->kind != Root)) &&
             (local_130->kind != CompilationUnit)) {
            local_98 = local_d0;
            local_a0 = local_120;
          }
        }
        __gnu_cxx::
        __normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
        ::operator++(&local_c0);
      }
      if (((local_a9 & 1) == 0) && (local_98 != (reference)0x0)) {
        in_stack_fffffffffffffcd0 = Symbol::as<slang::ast::InstanceSymbol>((Symbol *)0xaa5f8a);
        in_stack_fffffffffffffcc8 = InstanceSymbol::getDefinition((InstanceSymbol *)0xaa5f9b);
        in_stack_fffffffffffffcc0 =
             (Diagnostics *)DefinitionSymbol::getInstanceCount(in_stack_fffffffffffffcc8);
        if (local_a8 < in_stack_fffffffffffffcc0) {
          Diagnostic::Diagnostic
                    ((Diagnostic *)in_stack_fffffffffffffcd0,(Diagnostic *)in_stack_fffffffffffffcc8
                    );
          local_138 = local_a0;
          std::optional<unsigned_long>::optional<unsigned_long_&,_true>
                    ((optional<unsigned_long> *)
                     CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                     (unsigned_long *)in_stack_fffffffffffffca8);
          local_158 = local_1b0;
          uStack_150 = uStack_1a8;
          SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
                    ((SmallVectorBase<slang::Diagnostic> *)in_stack_fffffffffffffcb8,
                     (Diagnostic *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
          Diagnostic::~Diagnostic
                    ((Diagnostic *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
          goto LAB_00aa623f;
        }
      }
      local_1b8._M_current =
           (Diagnostic *)
           std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::begin
                     ((vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)
                      in_stack_fffffffffffffca8);
      __gnu_cxx::
      __normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
      ::operator*(&local_1b8);
      Diagnostic::Diagnostic
                ((Diagnostic *)in_stack_fffffffffffffcd0,(Diagnostic *)in_stack_fffffffffffffcc8);
      if ((local_a9 & 1) != 0) {
        std::optional<unsigned_long>::operator=
                  ((optional<unsigned_long> *)in_stack_fffffffffffffcc0,
                   (int *)in_stack_fffffffffffffcb8);
      }
      SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
                ((SmallVectorBase<slang::Diagnostic> *)in_stack_fffffffffffffcb8,
                 (Diagnostic *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
      Diagnostic::~Diagnostic
                ((Diagnostic *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
      __gnu_cxx::
      __normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
      ::operator++(&local_1b8);
      while( true ) {
        std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>::end
                  ((vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_> *)
                   in_stack_fffffffffffffca8);
        bVar1 = __gnu_cxx::
                operator==<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                          ((__normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                            *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0),
                           (__normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
                            *)in_stack_fffffffffffffca8);
        if (((bVar1 ^ 0xffU) & 1) == 0) break;
        __gnu_cxx::
        __normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
        ::operator*(&local_1b8);
        Diagnostic::Diagnostic
                  ((Diagnostic *)in_stack_fffffffffffffcd0,(Diagnostic *)in_stack_fffffffffffffcc8);
        in_stack_fffffffffffffcb8 = (SourceLocation)SmallVectorBase<slang::Diagnostic>::back(in_RDI)
        ;
        in_stack_fffffffffffffcb7 =
             Diagnostic::operator==(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
        if (((in_stack_fffffffffffffcb7 ^ 0xff) & 1) != 0) {
          if ((local_a9 & 1) != 0) {
            std::optional<unsigned_long>::operator=
                      ((optional<unsigned_long> *)in_stack_fffffffffffffcc0,
                       (int *)in_stack_fffffffffffffcb8);
          }
          SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
                    ((SmallVectorBase<slang::Diagnostic> *)in_stack_fffffffffffffcb8,
                     (Diagnostic *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
        }
        Diagnostic::~Diagnostic
                  ((Diagnostic *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
        __gnu_cxx::
        __normal_iterator<slang::Diagnostic_*,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>
        ::operator++(&local_1b8);
      }
    }
LAB_00aa623f:
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
    ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                  *)CONCAT17(in_stack_fffffffffffffcb7,in_stack_fffffffffffffcb0));
  } while( true );
}

Assistant:

Diagnostics ASTDiagMap::coalesce(const SourceManager* sourceManager) {
    Diagnostics results;
    for (auto& [key, diagList] : map) {
        // If the location is NoLocation, just issue each diagnostic.
        if (std::get<1>(key) == SourceLocation::NoLocation) {
            for (auto& diag : diagList)
                results.emplace_back(diag);
            continue;
        }

        // Try to find a diagnostic in an instance that isn't at the top-level
        // (printing such a path seems silly).
        const Diagnostic* found = nullptr;
        const Symbol* inst = nullptr;
        size_t count = 0;
        bool differingArgs = false;

        for (auto& diag : diagList) {
            if (found && *found != diag) {
                differingArgs = true;
                break;
            }

            auto symbol = diag.symbol;
            while (symbol && symbol->kind != SymbolKind::InstanceBody) {
                const Scope* scope;
                if (symbol->kind == SymbolKind::CheckerInstanceBody) {
                    auto& checkerBody = symbol->as<CheckerInstanceBodySymbol>();
                    SLANG_ASSERT(checkerBody.parentInstance);
                    scope = checkerBody.parentInstance->getParentScope();

                    // Add an expansion note to the diagnostic since
                    // we won't have added it yet for the checker.
                    if (!checkerBody.flags.has(InstanceFlags::Uninstantiated)) {
                        diag.addNote(diag::NoteWhileExpanding, checkerBody.parentInstance->location)
                            << "checker"sv << checkerBody.checker.name;
                    }
                }
                else {
                    scope = symbol->getParentScope();
                }

                symbol = scope ? &scope->asSymbol() : nullptr;
            }

            if (!symbol)
                continue;

            auto parent = symbol->as<InstanceBodySymbol>().parentInstance;
            SLANG_ASSERT(parent);

            count++;
            if (auto scope = parent->getParentScope()) {
                auto& sym = scope->asSymbol();
                if (sym.kind != SymbolKind::Root && sym.kind != SymbolKind::CompilationUnit) {
                    found = &diag;
                    inst = parent;
                }
            }
        }

        if (!differingArgs && found &&
            inst->as<InstanceSymbol>().getDefinition().getInstanceCount() > count) {
            // The diagnostic is present only in some instances, so include the coalescing
            // information to point the user towards the right ones.
            Diagnostic diag = *found;
            diag.symbol = inst;
            diag.coalesceCount = count;
            results.emplace_back(std::move(diag));
        }
        else {
            // Otherwise no coalescing. If we had differing arguments then set each
            // diagnostic's coalesce count to 1 (as opposed to letting it stay nullopt)
            // so that we get the instance path to it printed automatically.
            auto it = diagList.begin();
            SLANG_ASSERT(it != diagList.end());

            {
                Diagnostic d = *it;
                if (differingArgs)
                    d.coalesceCount = 1;
                results.emplace_back(std::move(d));
            }

            for (++it; it != diagList.end(); ++it) {
                Diagnostic d = *it;
                if (d != results.back()) {
                    if (differingArgs)
                        d.coalesceCount = 1;
                    results.emplace_back(std::move(d));
                }
            }
        }
    }

    if (sourceManager)
        results.sort(*sourceManager);

    return results;
}